

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O1

void timer_cb(uv_timer_t *timer,int status)

{
  long lVar1;
  int iVar2;
  uint64_t uVar3;
  
  lVar1 = *(long *)&timer[-1].tree_entry.rbe_color;
  if (lVar1 == 0) {
    __assert_fail("ctx->parent_handle != NULL","src/fs-poll.c",0x82,
                  "void timer_cb(uv_timer_t *, int)");
  }
  if ((int *)*(undefined1 **)(lVar1 + 0x40) == &timer[-1].tree_entry.rbe_color) {
    uVar3 = uv_now((uv_loop_t *)timer[-1].repeat);
    timer[-1].timeout = uVar3;
    iVar2 = uv_fs_stat((uv_loop_t *)timer[-1].repeat,(uv_fs_t *)(timer + 1),(char *)(timer + 5),
                       poll_cb);
    if (iVar2 == 0) {
      return;
    }
    abort();
  }
  __assert_fail("ctx->parent_handle->poll_ctx == ctx","src/fs-poll.c",0x83,
                "void timer_cb(uv_timer_t *, int)");
}

Assistant:

static void timer_cb(uv_timer_t* timer, int status) {
  struct poll_ctx* ctx;

  ctx = container_of(timer, struct poll_ctx, timer_handle);
  assert(ctx->parent_handle != NULL);
  assert(ctx->parent_handle->poll_ctx == ctx);
  ctx->start_time = uv_now(ctx->loop);

  if (uv_fs_stat(ctx->loop, &ctx->fs_req, ctx->path, poll_cb))
    abort();
}